

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall argstest::NamedBase::~NamedBase(NamedBase *this)

{
  NamedBase *this_local;
  
  ~NamedBase(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~NamedBase() {}